

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_stdlib.c
# Opt level: O2

int p2sc_string_isnumeric(char *s)

{
  int iVar1;
  int *piVar2;
  char *end;
  
  iVar1 = 0;
  if ((s != (char *)0x0) && (*s != '\0')) {
    g_ascii_strtod();
    piVar2 = __errno_location();
    if ((*piVar2 == 0x22) || (*piVar2 == 0)) {
      iVar1 = 1;
    }
    else {
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int p2sc_string_isnumeric(const char *s) {
    if (!s || !*s)
        return 0;

    char *end = NULL;
    double d __attribute__((unused)) = g_ascii_strtod(s, &end);
    if ((!errno || errno == ERANGE) && (!end || !*end))
        return 1;

    return 0;
}